

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Inline.cpp
# Opt level: O1

void __thiscall
Inline::AdjustArgoutsForCallTargetInlining
          (Inline *this,Instr *callInstr,Instr **pExplicitThisArgOut,bool isCallInstanceFunction)

{
  int iVar1;
  _func_int **pp_Var2;
  Func *pFVar3;
  code *pcVar4;
  bool bVar5;
  OpndKind OVar6;
  byte bVar7;
  ArgSlot AVar8;
  uint uVar9;
  undefined4 *puVar10;
  StackSym *pSVar11;
  Instr *this_00;
  Instr *pIVar12;
  Instr *pIVar13;
  Opnd *pOVar14;
  IntConstOpnd *pIVar15;
  Instr *pIVar16;
  Instr *pIVar17;
  Instr *pIVar18;
  Instr *functionArg;
  
  if (pExplicitThisArgOut == (Instr **)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar10 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Inline.cpp"
                       ,0xd73,"(pExplicitThisArgOut)","pExplicitThisArgOut");
    if (!bVar5) goto LAB_0055c1b3;
    *puVar10 = 0;
  }
  pSVar11 = IR::Opnd::GetStackSym(callInstr->m_src2);
  if (((pSVar11->field_0x18 & 1) == 0) || ((pSVar11->field_5).m_instrDef == (Instr *)0x0)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar10 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.h"
                       ,0x1af,"(linkSym->IsSingleDef())","linkSym->IsSingleDef()");
    if (!bVar5) goto LAB_0055c1b3;
    *puVar10 = 0;
  }
  pIVar12 = (pSVar11->field_5).m_instrDef;
  puVar10 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
  pIVar17 = (Instr *)0x0;
  pIVar13 = (Instr *)0x0;
  pIVar16 = (Instr *)0x0;
  do {
    if ((pIVar12->m_src2 == (Opnd *)0x0) ||
       (OVar6 = IR::Opnd::GetKind(pIVar12->m_src2), OVar6 != OpndKindSym)) {
      pIVar18 = (Instr *)0x0;
    }
    else {
      pOVar14 = pIVar12->m_src2;
      OVar6 = IR::Opnd::GetKind(pOVar14);
      if (OVar6 != OpndKindSym) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar10 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                           ,0x45,"(this->IsSymOpnd())","Bad call to AsSymOpnd()");
        if (!bVar5) goto LAB_0055c1b3;
        *puVar10 = 0;
      }
      pp_Var2 = pOVar14[1]._vptr_Opnd;
      if (*(char *)((long)pp_Var2 + 0x14) != '\x01') {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar10 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Sym.inl"
                           ,0x1f,"(this->IsStackSym())","Bad call to AsStackSym()");
        if (!bVar5) goto LAB_0055c1b3;
        *puVar10 = 0;
      }
      if (((*(byte *)((long)pp_Var2 + 0x1a) & 0x10) != 0) && (*(short *)((long)pp_Var2 + 0x16) == 0)
         ) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar10 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Sym.inl"
                           ,0x5b,"(this->m_slotNum != 0)","this->m_slotNum != 0");
        if (!bVar5) goto LAB_0055c1b3;
        *puVar10 = 0;
      }
      if ((*(byte *)((long)pp_Var2 + 0x1a) & 0x10) == 0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar10 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.h"
                           ,0x1b8,"(linkSym->IsArgSlotSym())","linkSym->IsArgSlotSym()");
        if (!bVar5) goto LAB_0055c1b3;
        *puVar10 = 0;
      }
      if ((((((ulong)pp_Var2[3] & 1) == 0) || (pp_Var2[5] == (_func_int *)0x0)) &&
          (bVar5 = Func::IsInPhase(callInstr->m_func,FGPeepsPhase), !bVar5)) &&
         (bVar5 = Func::IsInPhase(callInstr->m_func,FGBuildPhase), !bVar5)) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar10 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.h"
                           ,0x1bf,
                           "(linkSym->IsSingleDef() || (m_func->IsInPhase(Js::Phase::FGPeepsPhase) || m_func->IsInPhase(Js::Phase::FGBuildPhase)))"
                           ,
                           "linkSym->IsSingleDef() || (m_func->IsInPhase(Js::Phase::FGPeepsPhase) || m_func->IsInPhase(Js::Phase::FGBuildPhase))"
                          );
        if (!bVar5) goto LAB_0055c1b3;
        *puVar10 = 0;
      }
      if (((ulong)pp_Var2[3] & 1) == 0) {
        pIVar18 = (Instr *)0x0;
      }
      else {
        pIVar18 = (Instr *)pp_Var2[5];
      }
    }
    this_00 = pIVar16;
    if (pIVar12->m_opcode != ArgOut_A_InlineSpecialized) {
      if (pIVar12->m_opcode == StartCall) {
        if (pIVar18 != (Instr *)0x0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar10 = 1;
          bVar5 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.h"
                             ,0x1ce,"(nextArg == nullptr)","nextArg == nullptr");
          if (!bVar5) goto LAB_0055c1b3;
          *puVar10 = 0;
        }
        break;
      }
      IR::Instr::GenerateBytecodeArgOutCapture(pIVar12);
      pOVar14 = pIVar12->m_dst;
      OVar6 = IR::Opnd::GetKind(pOVar14);
      if (OVar6 != OpndKindSym) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar10 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                           ,0x45,"(this->IsSymOpnd())","Bad call to AsSymOpnd()");
        if (!bVar5) goto LAB_0055c1b3;
        *puVar10 = 0;
      }
      pSVar11 = IR::Opnd::GetStackSym(pOVar14);
      iVar1 = pSVar11->m_offset;
      AVar8 = StackSym::GetArgSlotNum(pSVar11);
      if (iVar1 != (uint)AVar8 * 8 + -8) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar10 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Inline.cpp"
                           ,0xd84,"(argSym->m_offset == (argSym->GetArgSlotNum() - 1) * MachPtr)",
                           "argSym->m_offset == (argSym->GetArgSlotNum() - 1) * MachPtr");
        if (!bVar5) goto LAB_0055c1b3;
        *puVar10 = 0;
      }
      StackSym::DecrementArgSlotNum(pSVar11);
      AVar8 = StackSym::GetArgSlotNum(pSVar11);
      if (AVar8 != 0) {
        Func::SetArgOffset(this->topFunc,pSVar11,pSVar11->m_offset + -8);
      }
      this_00 = pIVar12;
      pIVar13 = pIVar17;
      pIVar17 = pIVar16;
      if ((isCallInstanceFunction) && (AVar8 = StackSym::GetArgSlotNum(pSVar11), AVar8 != 0)) {
        StackSym::DecrementArgSlotNum(pSVar11);
      }
    }
    pIVar16 = this_00;
    pIVar12 = pIVar18;
  } while (pIVar18 != (Instr *)0x0);
  if (!isCallInstanceFunction) {
    pIVar13 = pIVar17;
  }
  if (pIVar13 == (Instr *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    *puVar10 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Inline.cpp"
                       ,0xd96,"(explicitThisArgOut)","explicitThisArgOut");
    if (!bVar5) goto LAB_0055c1b3;
    *puVar10 = 0;
  }
  bVar5 = IR::Instr::HasByteCodeArgOutCapture(pIVar13);
  if (!bVar5) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    *puVar10 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Inline.cpp"
                       ,0xd97,"(explicitThisArgOut->HasByteCodeArgOutCapture())",
                       "explicitThisArgOut->HasByteCodeArgOutCapture()");
    if (!bVar5) goto LAB_0055c1b3;
    *puVar10 = 0;
  }
  pOVar14 = this_00->m_src2;
  OVar6 = IR::Opnd::GetKind(pOVar14);
  if (OVar6 == OpndKindReg) {
    OVar6 = IR::Opnd::GetKind(pOVar14);
    if (OVar6 != OpndKindReg) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar10 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                         ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
      if (!bVar5) goto LAB_0055c1b3;
      *puVar10 = 0;
    }
    pSVar11 = IR::Opnd::GetStackSym(pOVar14);
    if (((pSVar11->field_0x18 & 1) == 0) || ((pSVar11->field_5).m_instrDef == (Instr *)0x0))
    goto LAB_0055bcb4;
  }
  else {
LAB_0055bcb4:
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    *puVar10 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Inline.cpp"
                       ,0xd9b,
                       "(linkOpnd->IsRegOpnd() && linkOpnd->AsRegOpnd()->GetStackSym()->IsSingleDef())"
                       ,
                       "linkOpnd->IsRegOpnd() && linkOpnd->AsRegOpnd()->GetStackSym()->IsSingleDef()"
                      );
    if (!bVar5) goto LAB_0055c1b3;
    *puVar10 = 0;
  }
  OVar6 = IR::Opnd::GetKind(pOVar14);
  if (OVar6 != OpndKindReg) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    *puVar10 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                       ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
    if (!bVar5) goto LAB_0055c1b3;
    *puVar10 = 0;
  }
  pSVar11 = IR::Opnd::GetStackSym(pOVar14);
  if ((pSVar11->field_0x18 & 1) == 0) {
    pIVar12 = (Instr *)0x0;
  }
  else {
    pIVar12 = (pSVar11->field_5).m_instrDef;
  }
  if (pIVar12->m_opcode != StartCall) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    *puVar10 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Inline.cpp"
                       ,0xd9c,
                       "(linkOpnd->AsRegOpnd()->GetStackSym()->GetInstrDef()->m_opcode == Js::OpCode::StartCall)"
                       ,
                       "linkOpnd->AsRegOpnd()->GetStackSym()->GetInstrDef()->m_opcode == Js::OpCode::StartCall"
                      );
    if (!bVar5) goto LAB_0055c1b3;
    *puVar10 = 0;
  }
  OVar6 = IR::Opnd::GetKind(pOVar14);
  if (OVar6 != OpndKindReg) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    *puVar10 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                       ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
    if (!bVar5) goto LAB_0055c1b3;
    *puVar10 = 0;
  }
  pSVar11 = IR::Opnd::GetStackSym(pOVar14);
  if ((pSVar11->field_0x18 & 1) == 0) {
    pIVar12 = (Instr *)0x0;
  }
  else {
    pIVar12 = (pSVar11->field_5).m_instrDef;
  }
  IR::Instr::ReplaceSrc2(pIVar13,pIVar12->m_dst);
  *pExplicitThisArgOut = pIVar13;
  if (isCallInstanceFunction) {
    pIVar13 = IR::Instr::New(BytecodeArgOutUse,callInstr->m_func,callInstr);
    IR::Instr::ReplaceSrc1(callInstr,pIVar17->m_src1);
    pOVar14 = pIVar17->m_src1;
    if (pIVar13->m_src1 != (Opnd *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar10 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                         ,0x16c,"(this->m_src1 == __null)","Trying to overwrite existing src.");
      if (!bVar5) goto LAB_0055c1b3;
      *puVar10 = 0;
    }
    pFVar3 = pIVar13->m_func;
    if (pOVar14->isDeleted == true) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar10 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                         ,0x14,"(!isDeleted)","Using deleted operand");
      if (!bVar5) goto LAB_0055c1b3;
      *puVar10 = 0;
    }
    bVar7 = pOVar14->field_0xb;
    if ((bVar7 & 2) != 0) {
      pOVar14 = IR::Opnd::Copy(pOVar14,pFVar3);
      bVar7 = pOVar14->field_0xb;
    }
    pOVar14->field_0xb = bVar7 | 2;
    pIVar13->m_src1 = pOVar14;
    IR::Instr::InsertBefore(callInstr,pIVar13);
    IR::Instr::Remove(pIVar17);
  }
  pIVar13 = IR::Instr::New(BytecodeArgOutUse,callInstr->m_func,callInstr);
  pOVar14 = this_00->m_src1;
  if (pIVar13->m_src1 != (Opnd *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    *puVar10 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                       ,0x16c,"(this->m_src1 == __null)","Trying to overwrite existing src.");
    if (!bVar5) goto LAB_0055c1b3;
    *puVar10 = 0;
  }
  pFVar3 = pIVar13->m_func;
  if (pOVar14->isDeleted == true) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    *puVar10 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                       ,0x14,"(!isDeleted)","Using deleted operand");
    if (!bVar5) goto LAB_0055c1b3;
    *puVar10 = 0;
  }
  bVar7 = pOVar14->field_0xb;
  if ((bVar7 & 2) != 0) {
    pOVar14 = IR::Opnd::Copy(pOVar14,pFVar3);
    bVar7 = pOVar14->field_0xb;
  }
  pOVar14->field_0xb = bVar7 | 2;
  pIVar13->m_src1 = pOVar14;
  IR::Instr::InsertBefore(callInstr,pIVar13);
  IR::Instr::Remove(this_00);
  uVar9 = IR::Instr::GetArgOutCount(pIVar12,false);
  pIVar15 = IR::IntConstOpnd::New((ulong)uVar9,TyUint32,pIVar12->m_func,false);
  if (pIVar12->m_src2 != (Opnd *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    *puVar10 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                       ,0x18b,"(this->m_src2 == __null)","Trying to overwrite existing src.");
    if (!bVar5) goto LAB_0055c1b3;
    *puVar10 = 0;
  }
  pFVar3 = pIVar12->m_func;
  if ((pIVar15->super_Opnd).isDeleted == true) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    *puVar10 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                       ,0x14,"(!isDeleted)","Using deleted operand");
    if (!bVar5) goto LAB_0055c1b3;
    *puVar10 = 0;
  }
  bVar7 = (pIVar15->super_Opnd).field_0xb;
  if ((bVar7 & 2) != 0) {
    pIVar15 = (IntConstOpnd *)IR::Opnd::Copy(&pIVar15->super_Opnd,pFVar3);
    bVar7 = (pIVar15->super_Opnd).field_0xb;
  }
  (pIVar15->super_Opnd).field_0xb = bVar7 | 2;
  pIVar12->m_src2 = &pIVar15->super_Opnd;
  pIVar15 = (IntConstOpnd *)pIVar12->m_src1;
  OVar6 = IR::Opnd::GetKind((Opnd *)pIVar15);
  if (OVar6 != OpndKindIntConst) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    *puVar10 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                       ,0xc0,"(this->IsIntConstOpnd())","Bad call to AsIntConstOpnd()");
    if (!bVar5) goto LAB_0055c1b3;
    *puVar10 = 0;
  }
  pOVar14 = pIVar12->m_src1;
  OVar6 = IR::Opnd::GetKind(pOVar14);
  if (OVar6 != OpndKindIntConst) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    *puVar10 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                       ,0xc0,"(this->IsIntConstOpnd())","Bad call to AsIntConstOpnd()");
    if (!bVar5) {
LAB_0055c1b3:
      pcVar4 = (code *)invalidInstructionException();
      (*pcVar4)();
    }
    *puVar10 = 0;
  }
  IR::IntConstOpnd::SetValue(pIVar15,~(ulong)isCallInstanceFunction + (long)pOVar14[1]._vptr_Opnd);
  return;
}

Assistant:

void
Inline::AdjustArgoutsForCallTargetInlining(IR::Instr* callInstr, IR::Instr ** pExplicitThisArgOut, bool isCallInstanceFunction)
{
    Assert(pExplicitThisArgOut);

    IR::Instr * firstArgOut = nullptr;
    IR::Instr * secondArgOut = nullptr;
    IR::Instr * thirdArgOut = nullptr;

    callInstr->IterateArgInstrs([&](IR::Instr* argInstr)
    {
        thirdArgOut = secondArgOut;
        secondArgOut = firstArgOut;
        firstArgOut = argInstr;

        argInstr->GenerateBytecodeArgOutCapture(); // Generate BytecodeArgOutCapture here to capture the implicit "this" argout (which will be removed) as well,
                                                   // so that any bailout in the call sequence restores the argouts stack as the interpreter would expect it to be.

        StackSym * argSym = argInstr->GetDst()->AsSymOpnd()->GetStackSym();
        
        Assert(argSym->m_offset == (argSym->GetArgSlotNum() - 1) * MachPtr);
        argSym->DecrementArgSlotNum(); // We will be removing implicit "this" argout
        if (argSym->GetArgSlotNum() != 0)
        {
            this->topFunc->SetArgOffset(argSym, argSym->m_offset - MachPtr);
        }

        if (isCallInstanceFunction && argSym->GetArgSlotNum() != 0)
        {
            argSym->DecrementArgSlotNum(); // We will also be removing the function argout
        }

        return false;
    });

    IR::Instr * implicitThisArgOut = firstArgOut;
    IR::Instr * explicitThisArgOut = isCallInstanceFunction ? thirdArgOut : secondArgOut;

    Assert(explicitThisArgOut);
    Assert(explicitThisArgOut->HasByteCodeArgOutCapture());


    IR::Opnd* linkOpnd = implicitThisArgOut->GetSrc2();
    Assert(linkOpnd->IsRegOpnd() && linkOpnd->AsRegOpnd()->GetStackSym()->IsSingleDef());
    Assert(linkOpnd->AsRegOpnd()->GetStackSym()->GetInstrDef()->m_opcode == Js::OpCode::StartCall);

    IR::Instr* startCall = linkOpnd->AsRegOpnd()->GetStackSym()->GetInstrDef();

    explicitThisArgOut->ReplaceSrc2(startCall->GetDst());
    *pExplicitThisArgOut = explicitThisArgOut;

    if (isCallInstanceFunction)
    {
        IR::Instr * functionArg = secondArgOut;
        IR::Instr * bytecodeArgOutUse = IR::Instr::New(Js::OpCode::BytecodeArgOutUse, callInstr->m_func, callInstr);
        callInstr->ReplaceSrc1(functionArg->GetSrc1());
        bytecodeArgOutUse->SetSrc1(functionArg->GetSrc1());
        callInstr->InsertBefore(bytecodeArgOutUse); // Need to keep the function argout live till the call instruction for it to be captured by any bailout in the call sequence.
        functionArg->Remove();
    }

    IR::Instr * bytecodeArgOutUse = IR::Instr::New(Js::OpCode::BytecodeArgOutUse, callInstr->m_func, callInstr);
    bytecodeArgOutUse->SetSrc1(implicitThisArgOut->GetSrc1());
    callInstr->InsertBefore(bytecodeArgOutUse); // Need to keep the implicit "this" argout live till the call instruction for it to be captured by any bailout in the call sequence.
    implicitThisArgOut->Remove();

    startCall->SetSrc2(IR::IntConstOpnd::New(startCall->GetArgOutCount(/*getInterpreterArgOutCount*/ false), TyUint32, startCall->m_func));

    uint argsRemoved = isCallInstanceFunction ? 2 : 1;
    startCall->GetSrc1()->AsIntConstOpnd()->SetValue(startCall->GetSrc1()->AsIntConstOpnd()->GetValue() - argsRemoved);
}